

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O0

void __thiscall nv::FloatImage::normalize(FloatImage *this,uint base_component)

{
  int iVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  scalar sVar5;
  Vector3 local_5c;
  Vector3 local_50;
  undefined1 local_44 [8];
  Vector3 normal;
  uint i;
  uint size;
  float *zChannel;
  float *yChannel;
  float *xChannel;
  uint base_component_local;
  FloatImage *this_local;
  
  if ((this->m_componentNum < base_component + 3) &&
     (iVar1 = nvAbort("base_component + 3 <= m_componentNum",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                      ,0xaa,"void nv::FloatImage::normalize(uint)"), iVar1 == 1)) {
    raise(5);
  }
  pfVar2 = channel(this,base_component);
  pfVar3 = channel(this,base_component + 1);
  pfVar4 = channel(this,base_component + 2);
  normal.m_z = (scalar)((uint)this->m_width * (uint)this->m_height);
  for (normal.m_y = 0.0; (uint)normal.m_y < (uint)normal.m_z;
      normal.m_y = (scalar)((int)normal.m_y + 1)) {
    Vector3::Vector3((Vector3 *)local_44,pfVar2[(uint)normal.m_y],pfVar3[(uint)normal.m_y],
                     pfVar4[(uint)normal.m_y]);
    Vector3::Vector3(&local_5c,zero);
    normalizeSafe((nv *)&local_50,(Arg)local_44,&local_5c,0.0);
    Vector3::operator=((Vector3 *)local_44,&local_50);
    sVar5 = Vector3::x((Vector3 *)local_44);
    pfVar2[(uint)normal.m_y] = sVar5;
    sVar5 = Vector3::y((Vector3 *)local_44);
    pfVar3[(uint)normal.m_y] = sVar5;
    sVar5 = Vector3::z((Vector3 *)local_44);
    pfVar4[(uint)normal.m_y] = sVar5;
  }
  return;
}

Assistant:

void FloatImage::normalize(uint base_component)
{
	nvCheck(base_component + 3 <= m_componentNum);
	
	float * xChannel = this->channel(base_component + 0);
	float * yChannel = this->channel(base_component + 1);
	float * zChannel = this->channel(base_component + 2);

	const uint size = m_width * m_height;
	for(uint i = 0; i < size; i++) {
		
		Vector3 normal(xChannel[i], yChannel[i], zChannel[i]);
		normal = normalizeSafe(normal, Vector3(zero), 0.0f);
		
		xChannel[i] = normal.x();
		yChannel[i] = normal.y();
		zChannel[i] = normal.z();
	}
}